

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ArgMinLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_argmin(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  ArgMinLayerParams *pAVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_argmin(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_argmin(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pAVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::ArgMinLayerParams>(arena);
    (this->layer_).argmin_ = pAVar2;
  }
  return (ArgMinLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ArgMinLayerParams* NeuralNetworkLayer::_internal_mutable_argmin() {
  if (!_internal_has_argmin()) {
    clear_layer();
    set_has_argmin();
    layer_.argmin_ = CreateMaybeMessage< ::CoreML::Specification::ArgMinLayerParams >(GetArenaForAllocation());
  }
  return layer_.argmin_;
}